

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_utils.c
# Opt level: O0

char * asterism_strstr(asterism_str haystack,asterism_str needle)

{
  int iVar1;
  ulong __n;
  ulong local_38;
  size_t i;
  asterism_str needle_local;
  asterism_str haystack_local;
  
  __n = needle.len;
  if (__n <= haystack.len) {
    for (local_38 = 0; local_38 <= haystack.len - __n; local_38 = local_38 + 1) {
      iVar1 = memcmp(haystack.p + local_38,needle.p,__n);
      if (iVar1 == 0) {
        return haystack.p + local_38;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *asterism_strstr(const struct asterism_str haystack,
                            const struct asterism_str needle)
{
    size_t i;
    if (needle.len > haystack.len)
        return NULL;
    for (i = 0; i <= haystack.len - needle.len; i++)
    {
        if (memcmp(haystack.p + i, needle.p, needle.len) == 0)
        {
            return haystack.p + i;
        }
    }
    return NULL;
}